

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O0

int av1_quantize_fp_no_qmatrix
              (int16_t *quant_ptr,int16_t *dequant_ptr,int16_t *round_ptr,int log_scale,
              int16_t *scan,int coeff_count,tran_low_t *coeff_ptr,tran_low_t *qcoeff_ptr,
              tran_low_t *dqcoeff_ptr)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  int64_t iVar5;
  byte bVar6;
  undefined4 in_ECX;
  short *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  tran_low_t abs_dqcoeff;
  int tmp32;
  int64_t abs_coeff;
  void *in_stack_00000018;
  int coeff_sign;
  int coeff;
  int32_t thresh;
  int rc;
  int i;
  int eob;
  int rounding [2];
  uint local_5c;
  int local_3c;
  int local_38;
  int local_34 [3];
  long local_28;
  undefined4 local_1c;
  short *local_18;
  long local_10;
  long local_8;
  
  local_34[2] = in_R9D;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset((void *)abs_coeff,0,(long)in_R9D << 2);
  memset(in_stack_00000018,0,(long)local_34[2] << 2);
  bVar6 = (byte)local_1c;
  local_34[0] = (int)*local_18 + ((1 << (bVar6 & 0x1f)) >> 1) >> (bVar6 & 0x1f);
  local_34[1] = (int)local_18[1] + ((1 << (bVar6 & 0x1f)) >> 1) >> (bVar6 & 0x1f);
  local_38 = 0;
  for (local_3c = 0; local_3c < local_34[2]; local_3c = local_3c + 1) {
    iVar2 = (int)*(short *)(local_28 + (long)local_3c * 2);
    uVar1 = *(uint *)(_abs_dqcoeff + (long)iVar2 * 4);
    uVar3 = 0;
    if ((int)uVar1 < 0) {
      uVar3 = 0xffffffff;
    }
    lVar4 = (long)(int)((uVar1 ^ uVar3) - uVar3);
    local_5c = 0;
    if ((long)(int)*(short *)(local_10 + (long)(int)(uint)(iVar2 != 0) * 2) <=
        lVar4 << ((char)local_1c + 1U & 0x3f)) {
      iVar5 = clamp64(lVar4 + local_34[(int)(uint)(iVar2 != 0)],-0x8000,0x7fff);
      local_5c = (uint)(iVar5 * *(short *)(local_8 + (long)(int)(uint)(iVar2 != 0) * 2) >>
                       (0x10 - (byte)local_1c & 0x3f));
      if (local_5c != 0) {
        *(uint *)(abs_coeff + (long)iVar2 * 4) = (local_5c ^ uVar3) - uVar3;
        *(uint *)((long)in_stack_00000018 + (long)iVar2 * 4) =
             ((int)(local_5c * (int)*(short *)(local_10 + (long)(int)(uint)(iVar2 != 0) * 2)) >>
              ((byte)local_1c & 0x1f) ^ uVar3) - uVar3;
      }
    }
    if (local_5c != 0) {
      local_38 = local_3c + 1;
    }
  }
  return local_38;
}

Assistant:

int av1_quantize_fp_no_qmatrix(const int16_t quant_ptr[2],
                               const int16_t dequant_ptr[2],
                               const int16_t round_ptr[2], int log_scale,
                               const int16_t *scan, int coeff_count,
                               const tran_low_t *coeff_ptr,
                               tran_low_t *qcoeff_ptr,
                               tran_low_t *dqcoeff_ptr) {
  memset(qcoeff_ptr, 0, coeff_count * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, coeff_count * sizeof(*dqcoeff_ptr));
  const int rounding[2] = { ROUND_POWER_OF_TWO(round_ptr[0], log_scale),
                            ROUND_POWER_OF_TWO(round_ptr[1], log_scale) };
  int eob = 0;
  for (int i = 0; i < coeff_count; i++) {
    const int rc = scan[i];
    const int32_t thresh = (int32_t)(dequant_ptr[rc != 0]);
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    int64_t abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
    int tmp32 = 0;
    if ((abs_coeff << (1 + log_scale)) >= thresh) {
      abs_coeff = clamp64(abs_coeff + rounding[rc != 0], INT16_MIN, INT16_MAX);
      tmp32 = (int)((abs_coeff * quant_ptr[rc != 0]) >> (16 - log_scale));
      if (tmp32) {
        qcoeff_ptr[rc] = (tmp32 ^ coeff_sign) - coeff_sign;
        const tran_low_t abs_dqcoeff =
            (tmp32 * dequant_ptr[rc != 0]) >> log_scale;
        dqcoeff_ptr[rc] = (abs_dqcoeff ^ coeff_sign) - coeff_sign;
      }
    }
    if (tmp32) eob = i + 1;
  }
  return eob;
}